

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O0

void demo2(void)

{
  Param *this;
  IMLE imleObj;
  Param param;
  int D;
  int d;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  Scalar *in_stack_fffffffffffffb00;
  Index in_stack_fffffffffffffb08;
  string local_4f0 [32];
  IMLE *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  Param *in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffc1c;
  Param *in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  IMLE *in_stack_fffffffffffffc30;
  IMLE *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  
  IMLE::Param::Param(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant
            (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),in_stack_fffffffffffffae8
            );
  this = (Param *)std::operator<<((ostream *)&std::cout,"\t --- Param constructor: ---");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  IMLE::IMLE(in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"cos1D.xml",(allocator *)&stack0xfffffffffffffb0f);
  IMLE::createDefaultParamFile
            (in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb0f);
  cos1D_testSaveLoadAndParamHandling<IMLE>(in_stack_fffffffffffffc60);
  IMLE::~IMLE(in_stack_fffffffffffffb30);
  IMLE::Param::~Param(this);
  return;
}

Assistant:

void demo2()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // Param constructor:
    cout << "\t --- Param constructor: ---" << endl;
    IMLE imleObj(d,D,param);

    // Default Param File:
    IMLE::createDefaultParamFile(d,D,"cos1D.xml");

    cos1D_testSaveLoadAndParamHandling(imleObj );
}